

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

bool __thiscall Escape::CGraph::isEdgeBinary(CGraph *this,VertexIdx v1,VertexIdx v2)

{
  long lVar1;
  EdgeIdx mid;
  EdgeIdx high;
  EdgeIdx low;
  VertexIdx v2_local;
  VertexIdx v1_local;
  CGraph *this_local;
  
  high = this->offsets[v1];
  mid = this->offsets[v1 + 1] + -1;
  while( true ) {
    if (mid < high) {
      return false;
    }
    lVar1 = (high + mid) / 2;
    if (this->nbors[lVar1] == v2) break;
    if (v2 < this->nbors[lVar1]) {
      mid = lVar1 + -1;
    }
    else {
      high = lVar1 + 1;
    }
  }
  return true;
}

Assistant:

bool CGraph::isEdgeBinary(VertexIdx v1, VertexIdx v2) const {
//     VertexIdx deg1 = offsets[v1+1] - offsets[v1];
//     VertexIdx deg2 = offsets[v2+1] - offsets[v2];

//     if(deg2 < deg1)
//     {
//         VertexIdx swp = v1;
//         v1 = v2;
//         v2 = swp;
//     }
//
    EdgeIdx low = offsets[v1];
    EdgeIdx high = offsets[v1 + 1] - 1;
    EdgeIdx mid;

    while (low <= high) {
        mid = (low + high) / 2;

        if (nbors[mid] == v2)
            return true;
        if (nbors[mid] > v2)
            high = mid - 1;
        else
            low = mid + 1;
    }
    return false;
}